

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_varint.cpp
# Opt level: O1

void anon_unknown.dwarf_2872f5::VarInt::check
               (uint64_t test_value,initializer_list<unsigned_char> *il)

{
  undefined1 auVar1 [8];
  byte *in;
  void *pvVar2;
  uint uVar3;
  void *__dest;
  ptrdiff_t _Num;
  size_t __n;
  char *pcVar4;
  ulong uVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  AssertHelper local_a0;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  byte *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  long local_58;
  void *local_50;
  void *local_48;
  long local_40;
  uint64_t local_38;
  
  local_88 = (undefined1  [8])il->_M_len;
  local_98.data_._0_4_ = 9;
  local_38 = test_value;
  if (test_value >> 0x38 == 0) {
    uVar3 = pstore::bit_count::clz(test_value | 1);
    local_98.data_._0_4_ = (0x3f - uVar3) / 7 + 1;
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_68,"il.size ()","pstore::varint::encoded_size (test_value)",
             (unsigned_long *)local_88,(uint *)&local_98);
  if (local_68._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if (pbStack_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar4 = (pbStack_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if (pbStack_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_60,pbStack_60);
  }
  local_68 = (byte *)0x0;
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = 0;
  pstore::varint::
  encode<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_38,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,il->_M_array,
             il->_M_array + il->_M_len,(allocator_type *)&local_a0);
  uVar5 = (long)local_48 - (long)local_50;
  if (uVar5 == 0) {
    __dest = (void *)0x0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar5);
  }
  pvVar2 = local_50;
  __n = (long)local_48 - (long)local_50;
  if (__n != 0) {
    memmove(__dest,local_50,__n);
  }
  local_88 = (undefined1  [8])0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,__n);
  auVar1 = local_88;
  if (local_48 != pvVar2) {
    memmove((void *)local_88,__dest,__n);
  }
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)auVar1 + __n);
  if (__dest != (void *)0x0) {
    operator_delete(__dest,uVar5);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_char>>::
  operator()(&local_98,local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)"buffer");
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,(long)local_78 - (long)local_88);
  }
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,local_40 - (long)local_50);
  }
  if ((char)local_98.data_ == '\0') {
    testing::Message::Message((Message *)local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar4 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_88 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_98.data_ = (AssertHelperData *)((long)pbStack_60 - (long)local_68);
  uVar3 = pstore::bit_count::ctz((ulong)*local_68 | 0x100);
  local_a0.data_._0_4_ = uVar3 + 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"buffer.size ()","pstore::varint::decode_size (buffer.data ())",
             (unsigned_long *)&local_98,(uint *)&local_a0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar4 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  in = local_68;
  uVar3 = pstore::bit_count::ctz((ulong)*local_68 | 0x100);
  local_98.data_ = (AssertHelperData *)pstore::varint::decode<unsigned_char*>(in,uVar3 + 1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"test_value","pstore::varint::decode (buffer.data ())",&local_38,
             (unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar4 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_varint.cpp"
               ,0x2c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if (local_68 != (byte *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return;
}

Assistant:

static void check (std::uint64_t test_value,
                           std::initializer_list<std::uint8_t> const & il) {
            EXPECT_EQ (il.size (), pstore::varint::encoded_size (test_value));
            std::vector<std::uint8_t> buffer;
            pstore::varint::encode (test_value, std::back_inserter (buffer));
            EXPECT_THAT (buffer, ::testing::ElementsAreArray (il));
            EXPECT_EQ (buffer.size (), pstore::varint::decode_size (buffer.data ()));
            EXPECT_EQ (test_value, pstore::varint::decode (buffer.data ()));
        }